

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O1

void __thiscall QDateTimeEdit::setTimeSpec(QDateTimeEdit *this,TimeSpec spec)

{
  QDebug *pQVar1;
  long in_FS_OFFSET;
  Data local_58;
  undefined4 uStack_50;
  undefined8 uStack_4c;
  undefined4 local_44;
  char *local_40;
  QDebug local_38;
  QDebug local_30;
  QDebug local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(int *)(*(long *)&(this->super_QAbstractSpinBox).super_QWidget.field_0x8 + 0x508) - UTC &
      TimeZone) != spec) {
    if (spec == LocalTime) {
      local_58._0_4_ = 1;
    }
    else {
      if (spec != UTC) {
        local_58._0_4_ = 2;
        local_58._4_4_ = 0;
        uStack_50 = 0;
        uStack_4c = 0;
        local_44 = 0;
        local_40 = "default";
        QMessageLogger::warning();
        pQVar1 = QDebug::operator<<(&local_38,"Ignoring attempt to set time-spec");
        local_30.stream = pQVar1->stream;
        *(int *)(local_30.stream + 0x28) = *(int *)(local_30.stream + 0x28) + 1;
        qt_QMetaEnum_debugOperator
                  (&local_28,(longlong)&local_30,(QMetaObject *)(ulong)spec,
                   (char *)&Qt::staticMetaObject);
        QDebug::operator<<(&local_28,"which needs ancillary data: see setTimeZone()");
        QDebug::~QDebug(&local_28);
        QDebug::~QDebug(&local_30);
        QDebug::~QDebug(&local_38);
        goto LAB_003ec421;
      }
      local_58._0_4_ = 2;
    }
    local_58._4_4_ = 0;
    setTimeZone(this,(QTimeZone *)&local_58.s);
    QTimeZone::~QTimeZone((QTimeZone *)&local_58.s);
  }
LAB_003ec421:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDateTimeEdit::setTimeSpec(Qt::TimeSpec spec)
{
    Q_D(QDateTimeEdit);
    if (spec != d->timeZone.timeSpec()) {
        switch (spec) {
        case Qt::UTC:
            setTimeZone(QTimeZone::UTC);
            break;
        case Qt::LocalTime:
            setTimeZone(QTimeZone::LocalTime);
            break;
        default:
            qWarning() << "Ignoring attempt to set time-spec" << spec
                       << "which needs ancillary data: see setTimeZone()";
            return;
        }
    }
}